

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::CreateContext::exec(CreateContext *this,Thread *t)

{
  ostream *poVar1;
  _func_int **pp_Var2;
  deUint32 dVar3;
  Thread *pTVar4;
  EGLContext pvVar5;
  TestError *this_00;
  EGLint attriblist [3];
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  pTVar4 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar4 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  ((this->m_context).m_ptr)->display = this->m_display;
  local_1c0 = 0x200003098;
  local_1b8 = 0x3038;
  local_1b0._0_8_ = pTVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 0x18),"Begin -- eglBindAPI(EGL_OPENGL_ES_API)",0x26);
  tcu::ThreadUtil::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_128);
  pp_Var2 = pTVar4[1].super_Thread._vptr_Thread;
  (**(code **)*pp_Var2)(pp_Var2,0x30a0);
  dVar3 = (**(code **)(*pTVar4[1].super_Thread._vptr_Thread + 0xf8))();
  eglu::checkError(dVar3,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x261);
  local_1b0._0_8_ = pTVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 0x18),"End -- eglBindAPI()",0x13);
  tcu::ThreadUtil::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_128);
  if ((this->m_shared).m_ptr == (GLES2Context *)0x0) {
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- eglCreateContext(",0x1a);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,", EGL_NO_CONTEXT, { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })",0x3e);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    pp_Var2 = pTVar4[1].super_Thread._vptr_Thread;
    pvVar5 = (EGLContext)
             (**(code **)(*pp_Var2 + 0x30))(pp_Var2,this->m_display,this->m_config,0,&local_1c0);
    ((this->m_context).m_ptr)->context = pvVar5;
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End -- ",7);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = eglCreateContext()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
  }
  else {
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- eglCreateContext(",0x1a);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,", { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })",0x2e);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    pp_Var2 = pTVar4[1].super_Thread._vptr_Thread;
    pvVar5 = (EGLContext)
             (**(code **)(*pp_Var2 + 0x30))
                       (pp_Var2,this->m_display,this->m_config,((this->m_shared).m_ptr)->context,
                        &local_1c0);
    ((this->m_context).m_ptr)->context = pvVar5;
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End -- ",7);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = eglCreateContext()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_128);
  dVar3 = (**(code **)(*pTVar4[1].super_Thread._vptr_Thread + 0xf8))();
  eglu::checkError(dVar3,"Failed to create GLES2 context",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x275);
  if (((this->m_context).m_ptr)->context != (EGLContext)0x0) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_context->context != EGL_NO_CONTEXT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0x276);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void CreateContext::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	m_context->display = m_display;

	const EGLint attriblist[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	thread.newMessage() << "Begin -- eglBindAPI(EGL_OPENGL_ES_API)" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_CALL(thread.egl, bindAPI(EGL_OPENGL_ES_API));
	thread.newMessage() << "End -- eglBindAPI()" << tcu::ThreadUtil::Message::End;

	if (m_shared)
	{
		DE_ASSERT(m_shared->context != EGL_NO_CONTEXT);
		DE_ASSERT(m_shared->display != EGL_NO_DISPLAY);
		DE_ASSERT(m_shared->display == m_display);

		thread.newMessage() << "Begin -- eglCreateContext(" << m_display << ", " << m_config << ", " << m_shared->context << ", { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })" << tcu::ThreadUtil::Message::End;
		m_context->context = thread.egl.createContext(m_display, m_config, m_shared->context, attriblist);
		thread.newMessage() << "End -- " << m_context->context << " = eglCreateContext()" << tcu::ThreadUtil::Message::End;
	}
	else
	{
		thread.newMessage() << "Begin -- eglCreateContext(" << m_display << ", " << m_config << ", EGL_NO_CONTEXT, { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })" << tcu::ThreadUtil::Message::End;
		m_context->context = thread.egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attriblist);
		thread.newMessage() << "End -- " << m_context->context << " = eglCreateContext()" << tcu::ThreadUtil::Message::End;
	}

	EGLU_CHECK_MSG(thread.egl, "Failed to create GLES2 context");
	TCU_CHECK(m_context->context != EGL_NO_CONTEXT);
}